

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDebuggerObject.cpp
# Opt level: O3

void __thiscall JsrtDebugStackFrames::ClearFrameDictionary(JsrtDebugStackFrames *this)

{
  int iVar1;
  JsrtDebuggerStackFrame *this_00;
  uint uVar2;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *this_01;
  ulong uVar3;
  BaseDictionary<unsigned_int,_JsrtDebuggerStackFrame_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_02;
  int iVar4;
  
  this_02 = this->framesDictionary;
  if (this_02 ==
      (BaseDictionary<unsigned_int,_JsrtDebuggerStackFrame_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
       *)0x0) {
    return;
  }
  uVar2 = this_02->bucketCount;
  if (uVar2 != 0) {
    uVar3 = 0;
    do {
      iVar4 = this_02->buckets[uVar3];
      if (iVar4 != -1) {
        do {
          iVar1 = this_02->entries[iVar4].
                  super_DefaultHashedEntry<unsigned_int,_JsrtDebuggerStackFrame_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                  .super_KeyValueEntry<unsigned_int,_JsrtDebuggerStackFrame_*>.
                  super_ValueEntry<JsrtDebuggerStackFrame_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_JsrtDebuggerStackFrame_*>_>
                  .super_KeyValueEntryDataLayout2<unsigned_int,_JsrtDebuggerStackFrame_*>.next;
          this_00 = this_02->entries[iVar4].
                    super_DefaultHashedEntry<unsigned_int,_JsrtDebuggerStackFrame_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                    .super_KeyValueEntry<unsigned_int,_JsrtDebuggerStackFrame_*>.
                    super_ValueEntry<JsrtDebuggerStackFrame_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_JsrtDebuggerStackFrame_*>_>
                    .super_KeyValueEntryDataLayout2<unsigned_int,_JsrtDebuggerStackFrame_*>.value;
          this_01 = &JsrtDebugManager::GetDebugObjectArena(this->jsrtDebugManager)->
                     super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
          JsrtDebuggerStackFrame::~JsrtDebuggerStackFrame(this_00);
          Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
                    (this_01,this_00,0x18);
          iVar4 = iVar1;
        } while (iVar1 != -1);
        uVar2 = this_02->bucketCount;
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < uVar2);
    this_02 = this->framesDictionary;
  }
  JsUtil::
  BaseDictionary<unsigned_int,_JsrtDebuggerStackFrame_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::Clear(this_02);
  return;
}

Assistant:

void JsrtDebugStackFrames::ClearFrameDictionary()
{
    if (this->framesDictionary != nullptr)
    {
        this->framesDictionary->Map([this](uint handle, JsrtDebuggerStackFrame* debuggerStackFrame) {
            Adelete(this->jsrtDebugManager->GetDebugObjectArena(), debuggerStackFrame);
        });
        this->framesDictionary->Clear();
    }
}